

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::SymlinkCommand::start
          (SymlinkCommand *this,BuildSystem *param_1,TaskInterface ti)

{
  pointer ppBVar1;
  pointer ppBVar2;
  TaskInterface local_78;
  string local_68 [32];
  string local_48 [32];
  
  local_78.ctx = ti.ctx;
  local_78.impl = ti.impl;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->super_Command).inputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1;
      ppBVar2 = ppBVar2 + 1) {
    llbuild::buildsystem::BuildKey::makeNode((BuildKey *)local_68,&(*ppBVar2)->super_Node);
    std::__cxx11::string::string(local_48,local_68);
    llbuild::core::TaskInterface::mustFollow(&local_78,(KeyType *)local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

virtual void start(BuildSystem&, TaskInterface ti) override {
    // The command itself takes no inputs, so just treat any declared inputs as
    // "must follow" directives.
    //
    // FIXME: We should make this explicit once we have actual support for must
    // follow inputs.
    for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it) {
      ti.mustFollow(BuildKey::makeNode(*it).toData());
    }
  }